

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_audio_buffer_uninit_ex(ma_audio_buffer *pAudioBuffer,ma_bool32 doFree)

{
  int in_ESI;
  long in_RDI;
  ma_allocation_callbacks *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI != 0) {
    if ((*(int *)(in_RDI + 0x90) != 0) && (*(long *)(in_RDI + 0x68) != in_RDI + 0x94)) {
      ma_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    }
    if (in_ESI != 0) {
      ma_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    }
    ma_audio_buffer_ref_uninit((ma_audio_buffer_ref *)0x1ddd4a);
  }
  return;
}

Assistant:

static void ma_audio_buffer_uninit_ex(ma_audio_buffer* pAudioBuffer, ma_bool32 doFree)
{
    if (pAudioBuffer == NULL) {
        return;
    }

    if (pAudioBuffer->ownsData && pAudioBuffer->ref.pData != &pAudioBuffer->_pExtraData[0]) {
        ma_free((void*)pAudioBuffer->ref.pData, &pAudioBuffer->allocationCallbacks);    /* Naugty const cast, but OK in this case since we've guarded it with the ownsData check. */
    }

    if (doFree) {
        ma_free(pAudioBuffer, &pAudioBuffer->allocationCallbacks);
    }

    ma_audio_buffer_ref_uninit(&pAudioBuffer->ref);
}